

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_4::Validator::OnMemoryInitExpr(Validator *this,MemoryInitExpr *expr)

{
  Result RVar1;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_78,&expr->var);
  Var::Var(&local_c0,&(expr->super_MemoryExpr<(wabt::ExprType)32>).memidx);
  RVar1 = SharedValidator::OnMemoryInit
                    (&this->validator_,
                     &(expr->super_MemoryExpr<(wabt::ExprType)32>).
                      super_ExprMixin<(wabt::ExprType)32>.super_Expr.loc,&local_78,&local_c0);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  return (Result)Ok;
}

Assistant:

Result Validator::OnMemoryInitExpr(MemoryInitExpr* expr) {
  result_ |= validator_.OnMemoryInit(expr->loc, expr->var, expr->memidx);
  return Result::Ok;
}